

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

size_t __thiscall rtosc::Port::MetaContainer::length(MetaContainer *this)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  char cVar5;
  
  pcVar1 = this->str_ptr;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    sVar4 = 2;
    cVar5 = '\x01';
    do {
      lVar3 = sVar4 - 1;
      sVar4 = sVar4 + 1;
      bVar2 = cVar5 != '\0';
      cVar5 = pcVar1[lVar3];
    } while (bVar2 || pcVar1[lVar3] != '\0');
    return sVar4;
  }
  return 0;
}

Assistant:

size_t Port::MetaContainer::length(void) const
{
        if(!str_ptr || !*str_ptr)
            return 0;
        char prev = 0;
        const char *itr = str_ptr;
        while(prev || *itr)
            prev = *itr++;
        return 2+(itr-str_ptr);
}